

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O3

int isAftSpell(int aftype)

{
  int iVar1;
  
  iVar1 = 0;
  if (0xfffffff8 < aftype - 8U) {
    iVar1 = aftype;
  }
  return iVar1;
}

Assistant:

int isAftSpell(int aftype)
{
	if (aftype != AFT_SKILL
		&& aftype != AFT_POWER
		&& aftype != AFT_MALADY
		&& aftype != AFT_INVIS
		&& aftype != AFT_RUNE
		&& aftype != AFT_COMMUNE
		&& aftype != AFT_TIMER)
	{
		aftype = AFT_SPELL;
	}

	return aftype;
}